

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

int __thiscall NTrodeObj::copy(NTrodeObj *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  NTrodeObj *this_00;
  size_type sVar1;
  int i;
  NTrodeObj *newObj;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  NTrodeObj *in_stack_ffffffffffffffc0;
  NTrodeObj *this_01;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe4;
  
  this_00 = (NTrodeObj *)operator_new(0x48);
  NTrodeObj((NTrodeObj *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  setId(in_stack_ffffffffffffffc0,
        (string *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  iVar2 = 0;
  while( true ) {
    iVar3 = iVar2;
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->hw_chans);
    if ((int)sVar1 <= iVar2) break;
    this_01 = this_00;
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)this_00,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    addHWChan(this_01,in_stack_ffffffffffffffbc);
    iVar2 = iVar3 + 1;
  }
  return (int)this_00;
}

Assistant:

NTrodeObj* NTrodeObj::copy() {
    NTrodeObj* newObj = new NTrodeObj();
    newObj->setId(id);
    for (int i = 0; i < (int)hw_chans.size(); i++) {
        newObj->addHWChan(hw_chans.at(i));
    }
    return(newObj);
}